

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdCelsiusRcInColor::is_valid_val(MthdCelsiusRcInColor *this)

{
  uint uVar1;
  int local_1c;
  int reg;
  int j;
  MthdCelsiusRcInColor *this_local;
  
  local_1c = 0;
  while( true ) {
    if (3 < local_1c) {
      return true;
    }
    uVar1 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val <<
                   (0x3cU - (char)(local_1c << 3) & 0x3f)) >> 0x3c);
    if ((((uVar1 == 6) || (uVar1 == 7)) || (uVar1 == 10)) || ((uVar1 == 0xb || (0xd < uVar1))))
    break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool is_valid_val() override {
		for (int j = 0; j < 4; j++) {
			int reg = extr(val, 8 * j, 4);
			if (reg == 6 || reg == 7 || reg == 0xa || reg == 0xb || reg >= 0xe)
				return false;
		}
		return true;
	}